

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_builder.cc
# Opt level: O3

void __thiscall
leveldb::TableBuilder::WriteRawBlock
          (TableBuilder *this,Slice *block_contents,CompressionType type,BlockHandle *handle)

{
  Rep *pRVar1;
  char *pcVar2;
  uint32_t uVar3;
  Status SVar4;
  char trailer [5];
  char local_3d;
  int local_3c;
  Status local_38;
  undefined8 local_30;
  Status local_28;
  
  pRVar1 = this->rep_;
  handle->offset_ = pRVar1->offset;
  handle->size_ = block_contents->size_;
  (*pRVar1->file->_vptr_WritableFile[2])(&local_38,pRVar1->file,block_contents);
  pcVar2 = (pRVar1->status).state_;
  (pRVar1->status).state_ = local_38.state_;
  SVar4.state_ = local_38.state_;
  local_38.state_ = pcVar2;
  if (pcVar2 != (char *)0x0) {
    operator_delete__(pcVar2);
    SVar4.state_ = (pRVar1->status).state_;
  }
  if (SVar4.state_ == (char *)0x0) {
    local_3d = (char)type;
    uVar3 = crc32c::Extend(0,block_contents->data_,block_contents->size_);
    uVar3 = crc32c::Extend(uVar3,&local_3d,1);
    local_3c = (uVar3 << 0x11 | uVar3 >> 0xf) + 0xa282ead8;
    local_30 = 5;
    local_38.state_ = &local_3d;
    (*pRVar1->file->_vptr_WritableFile[2])(&local_28);
    pcVar2 = (pRVar1->status).state_;
    (pRVar1->status).state_ = local_28.state_;
    if (pcVar2 != (char *)0x0) {
      local_28.state_ = pcVar2;
      operator_delete__(pcVar2);
      local_28.state_ = (pRVar1->status).state_;
    }
    if (local_28.state_ == (char *)0x0) {
      pRVar1->offset = block_contents->size_ + pRVar1->offset + 5;
    }
  }
  return;
}

Assistant:

void TableBuilder::WriteRawBlock(const Slice& block_contents,
                                 CompressionType type, BlockHandle* handle) {
  Rep* r = rep_;
  handle->set_offset(r->offset);
  handle->set_size(block_contents.size());
  r->status = r->file->Append(block_contents);
  if (r->status.ok()) {
    char trailer[kBlockTrailerSize];
    trailer[0] = type;
    uint32_t crc = crc32c::Value(block_contents.data(), block_contents.size());
    crc = crc32c::Extend(crc, trailer, 1);  // Extend crc to cover block type
    EncodeFixed32(trailer + 1, crc32c::Mask(crc));
    r->status = r->file->Append(Slice(trailer, kBlockTrailerSize));
    if (r->status.ok()) {
      r->offset += block_contents.size() + kBlockTrailerSize;
    }
  }
}